

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_7z.c
# Opt level: O0

int szipLoadEntries(SZIPinfo *info)

{
  uint uVar1;
  int iVar2;
  uint local_24;
  PHYSFS_uint32 i;
  PHYSFS_uint32 count;
  int retval;
  SZIPinfo *info_local;
  
  i = 0;
  iVar2 = __PHYSFS_DirTreeInit(&info->tree,0x30);
  if (iVar2 != 0) {
    uVar1 = (info->db).NumFiles;
    for (local_24 = 0; local_24 < uVar1; local_24 = local_24 + 1) {
      iVar2 = szipLoadEntry(info,local_24);
      if (iVar2 == 0) {
        return 0;
      }
    }
    i = 1;
  }
  return i;
}

Assistant:

static int szipLoadEntries(SZIPinfo *info)
{
    int retval = 0;

    if (__PHYSFS_DirTreeInit(&info->tree, sizeof (SZIPentry)))
    {
        const PHYSFS_uint32 count = info->db.NumFiles;
        PHYSFS_uint32 i;
        for (i = 0; i < count; i++)
            BAIL_IF_ERRPASS(!szipLoadEntry(info, i), 0);
        retval = 1;
    } /* if */

    return retval;
}